

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall
Catch::StreamBufImpl<Catch::OutputDebugWriter,_256UL>::overflow
          (StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this,int c)

{
  char cVar1;
  long lVar2;
  long lVar3;
  allocator local_39;
  string local_38 [36];
  int local_14;
  StreamBufImpl<Catch::OutputDebugWriter,_256UL> *pSStack_10;
  int c_local;
  StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this_local;
  
  local_14 = c;
  pSStack_10 = this;
  (**(code **)(*(long *)&this->super_StreamBufBase + 0x30))();
  if (local_14 != -1) {
    lVar2 = std::streambuf::pbase();
    lVar3 = std::streambuf::epptr();
    if (lVar2 == lVar3) {
      cVar1 = (char)local_14;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,1,cVar1,&local_39);
      OutputDebugWriter::operator()((OutputDebugWriter *)&this->field_0x140,(string *)local_38);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    else {
      std::streambuf::sputc((char)this);
    }
  }
  return 0;
}

Assistant:

int overflow( int c ) {
            sync();

            if( c != EOF ) {
                if( pbase() == epptr() )
                    m_writer( std::string( 1, static_cast<char>( c ) ) );
                else
                    sputc( static_cast<char>( c ) );
            }
            return 0;
        }